

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::StreamingReporterBase<Catch::ConsoleReporter>::testGroupEnded
          (StreamingReporterBase<Catch::ConsoleReporter> *this,TestGroupStats *param_2)

{
  LazyStat<Catch::GroupInfo> *in_RSI;
  
  LazyStat<Catch::GroupInfo>::reset(in_RSI);
  return;
}

Assistant:

void testGroupEnded(TestGroupStats const& /* _testGroupStats */) override {
            currentGroupInfo.reset();
        }